

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

uint * __thiscall
HashTable<unsigned_int,_Memory::JitArenaAllocator>::FindOrInsert
          (HashTable<unsigned_int,_Memory::JitArenaAllocator> *this,uint element,int value)

{
  int iVar1;
  code *pcVar2;
  NodeBase *pNVar3;
  bool bVar4;
  char cVar5;
  Type *pTVar6;
  undefined4 *puVar7;
  uint depth;
  Type *unaff_R13;
  undefined1 local_58 [8];
  EditingIterator iter;
  
  local_58 = (undefined1  [8])(this->table + (ulong)(uint)value % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  depth = 1;
  iter.super_Iterator.list =
       (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)local_58;
  iter.last = (NodeBase *)this;
  do {
    bVar4 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
            Next((EditingIterator *)local_58);
    if (!bVar4) goto LAB_00431c4a;
    pTVar6 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_58);
    iVar1 = pTVar6->value;
    if (iVar1 != value) {
      pTVar6 = unaff_R13;
    }
    if (iVar1 <= value) {
      unaff_R13 = pTVar6;
    }
    cVar5 = (iVar1 != value) * '\x02' + '\x01';
    if (value < iVar1) {
      cVar5 = '\0';
    }
    depth = depth + (value < iVar1);
  } while (cVar5 == '\0');
  if (cVar5 == '\x03') {
LAB_00431c4a:
    pNVar3 = iter.last;
    pTVar6 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
             InsertNodeBefore((EditingIterator *)local_58,(ArenaAllocator *)(iter.last)->next);
    if (pTVar6 == (Type *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/HashTable.h"
                         ,0x99,"(newBucket != nullptr)","newBucket != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    pTVar6->value = value;
    pTVar6->element = element;
    if ((DictionaryStats *)pNVar3[3].next != (DictionaryStats *)0x0) {
      DictionaryStats::Insert((DictionaryStats *)pNVar3[3].next,depth);
    }
    unaff_R13 = (Type *)0x0;
  }
  return &unaff_R13->element;
}

Assistant:

T * FindOrInsert(T element, int value)
    {
        uint hash = this->Hash(value);

#if PROFILE_DICTIONARY
        uint depth = 1;
#endif
        // Keep sorted
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[hash], iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    return &(bucket.element);
                }
                break;
            }
#if PROFILE_DICTIONARY
            ++depth;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;

        Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
        Assert(newBucket != nullptr);
        newBucket->value = value;
        newBucket->element = element;
#if PROFILE_DICTIONARY
        if (stats)
            stats->Insert(depth);
#endif
        return nullptr;
    }